

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O3

int __thiscall S2CopyingEdgeCrosser::CrossingSign(S2CopyingEdgeCrosser *this,S2Point *d)

{
  VType VVar1;
  bool bVar2;
  int iVar3;
  S2LogMessage local_20;
  
  bVar2 = S2::IsUnitLength(d);
  if (bVar2) {
    iVar3 = s2pred::TriageSign((this->crosser_).a_,(this->crosser_).b_,d,
                               &(this->crosser_).a_cross_b_);
    if ((iVar3 == 0) || ((this->crosser_).acb_ != -iVar3)) {
      (this->crosser_).bda_ = iVar3;
      iVar3 = S2EdgeCrosser::CrossingSignInternal(&this->crosser_,d);
    }
    else {
      (this->crosser_).c_ = d;
      iVar3 = -1;
    }
    (this->c_).c_[2] = d->c_[2];
    VVar1 = d->c_[1];
    (this->c_).c_[0] = d->c_[0];
    (this->c_).c_[1] = VVar1;
    (this->crosser_).c_ = &this->c_;
    return iVar3;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
             ,0x108,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.stream_,"Check failed: S2::IsUnitLength(*d) ",0x23);
  abort();
}

Assistant:

inline int S2CopyingEdgeCrosser::CrossingSign(const S2Point& d) {
  int result = crosser_.CrossingSign(&d);
  c_ = d;
  crosser_.set_c(&c_);
  return result;
}